

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

int Sbd_ManCollectConstantsNew
              (sat_solver *pSat,Vec_Int_t *vDivVars,int nConsts,int PivotVar,word *pOnset,
              word *pOffset)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  word *pPats [2];
  int local_50;
  int iVar;
  int iLit;
  int status;
  int k;
  int i;
  int n;
  int nBTLimit;
  word *pOffset_local;
  word *pOnset_local;
  int PivotVar_local;
  int nConsts_local;
  Vec_Int_t *vDivVars_local;
  sat_solver *pSat_local;
  
  i = 0;
  pPats[0] = pOffset;
  _n = pOffset;
  pOffset_local = pOnset;
  pOnset_local._0_4_ = PivotVar;
  pOnset_local._4_4_ = nConsts;
  _PivotVar_local = vDivVars;
  vDivVars_local = (Vec_Int_t *)pSat;
  iVar1 = Vec_IntSize(vDivVars);
  if (0x3f < iVar1) {
    __assert_fail("Vec_IntSize(vDivVars) < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x1b6,
                  "int Sbd_ManCollectConstantsNew(sat_solver *, Vec_Int_t *, int, int, word *, word *)"
                 );
  }
  k = 0;
  do {
    if (1 < k) {
      return -1;
    }
    for (status = 0; status < pOnset_local._4_4_; status = status + 1) {
      sat_solver_random_polarity((sat_solver *)vDivVars_local);
      local_50 = Abc_Var2Lit((int)pOnset_local,k);
      iVar = sat_solver_solve((sat_solver *)vDivVars_local,&local_50,&iVar,(long)i,0,0,0);
      if (iVar == 0) {
        return -2;
      }
      if (iVar == -1) {
        return k;
      }
      bVar3 = k != 0;
      iVar1 = Vec_IntSize(_PivotVar_local);
      pPats[(long)k + -1][status] = (long)(int)(uint)((bVar3 ^ 0xffU) & 1) << ((byte)iVar1 & 0x3f);
      for (iLit = 0; iVar1 = iLit, iVar2 = Vec_IntSize(_PivotVar_local), iVar1 < iVar2;
          iLit = iLit + 1) {
        pPats[1]._4_4_ = Vec_IntEntry(_PivotVar_local,iLit);
        iVar1 = sat_solver_var_value((sat_solver *)vDivVars_local,pPats[1]._4_4_);
        if (iVar1 != 0) {
          Abc_TtXorBit(pPats[(long)k + -1] + status,iLit);
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int Sbd_ManCollectConstantsNew( sat_solver * pSat, Vec_Int_t * vDivVars, int nConsts, int PivotVar, word * pOnset, word * pOffset )
{
    int nBTLimit = 0;
    int n, i, k, status, iLit, iVar; 
    word * pPats[2] = {pOnset, pOffset};
    assert( Vec_IntSize(vDivVars) < 64 );
    for ( n = 0; n < 2; n++ )
    for ( i = 0; i < nConsts; i++ )
    {
        sat_solver_random_polarity( pSat );
        iLit = Abc_Var2Lit( PivotVar, n );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return n;
        pPats[n][i] = ((word)!n) << Vec_IntSize(vDivVars);
        Vec_IntForEachEntry( vDivVars, iVar, k )
            if ( sat_solver_var_value(pSat, iVar) )
                Abc_TtXorBit(&pPats[n][i], k);
    }
    return -1;
}